

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O1

bool __thiscall QFontDialog::eventFilter(QFontDialog *this,QObject *o,QEvent *e)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  QLineEdit *this_00;
  long in_FS_OFFSET;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (*(short *)(e + 8) == 8) {
    pQVar4 = QWidget::style((QWidget *)this);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0xd,0,this,0);
    if (iVar3 == 0) goto LAB_00504b4e;
    if (*(QObject **)(lVar1 + 0x2f0) == o) {
      this_00 = *(QLineEdit **)(lVar1 + 0x2e8);
    }
    else if (*(QObject **)(lVar1 + 0x308) == o) {
      this_00 = *(QLineEdit **)(lVar1 + 0x300);
    }
    else {
      if (*(QObject **)(lVar1 + 800) != o) goto LAB_00504c41;
      this_00 = *(QLineEdit **)(lVar1 + 0x318);
    }
    QLineEdit::selectAll(this_00);
  }
  else {
    if (*(short *)(e + 8) == 6) {
      if (((*(QObject **)(lVar1 + 0x318) == o) && (*(int *)(e + 0x40) + 0xfeffffedU < 5)) &&
         (*(int *)(e + 0x40) + 0xfeffffedU != 1)) {
        QAbstractItemView::currentIndex(&local_48,*(QAbstractItemView **)(lVar1 + 800));
        iVar3 = local_48.r;
        QCoreApplication::sendEvent(*(QObject **)(lVar1 + 800),e);
        QAbstractItemView::currentIndex(&local_48,*(QAbstractItemView **)(lVar1 + 800));
        if (iVar3 != local_48.r) {
          pQVar4 = QWidget::style((QWidget *)this);
          iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0xd,0,this,0);
          if (iVar3 != 0) {
            QLineEdit::selectAll(*(QLineEdit **)(lVar1 + 0x318));
          }
        }
      }
      else {
        if (((*(QObject **)(lVar1 + 0x2f0) != o) && (*(QObject **)(lVar1 + 0x308) != o)) ||
           ((*(uint *)(e + 0x40) & 0xfffffffe) != 0x1000004)) goto LAB_00504c41;
        e[0xc] = (QEvent)0x1;
        (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1b8))(this);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return true;
      }
      goto LAB_00504c6b;
    }
LAB_00504b4e:
    if ((*(short *)(e + 8) == 2) && (*(QObject **)(lVar1 + 800) == o)) {
      QWidget::setFocus(*(QWidget **)(lVar1 + 0x318),OtherFocusReason);
    }
  }
LAB_00504c41:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    bVar2 = QDialog::eventFilter(&this->super_QDialog,o,e);
    return bVar2;
  }
LAB_00504c6b:
  __stack_chk_fail();
}

Assistant:

bool QFontDialog::eventFilter(QObject *o , QEvent *e)
{
    Q_D(QFontDialog);
    if (e->type() == QEvent::KeyPress) {
        QKeyEvent *k = static_cast<QKeyEvent *>(e);
        if (o == d->sizeEdit &&
        (k->key() == Qt::Key_Up ||
             k->key() == Qt::Key_Down ||
         k->key() == Qt::Key_PageUp ||
         k->key() == Qt::Key_PageDown)) {

            int ci = d->sizeList->currentItem();
            QCoreApplication::sendEvent(d->sizeList, k);

            if (ci != d->sizeList->currentItem()
                    && style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, this))
                d->sizeEdit->selectAll();
            return true;
        } else if ((o == d->familyList || o == d->styleList) &&
                    (k->key() == Qt::Key_Return || k->key() == Qt::Key_Enter)) {
            k->accept();
        accept();
            return true;
        }
    } else if (e->type() == QEvent::FocusIn
               && style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, this)) {
        if (o == d->familyList)
            d->familyEdit->selectAll();
        else if (o == d->styleList)
            d->styleEdit->selectAll();
        else if (o == d->sizeList)
            d->sizeEdit->selectAll();
    } else if (e->type() == QEvent::MouseButtonPress && o == d->sizeList) {
            d->sizeEdit->setFocus();
    }
    return QDialog::eventFilter(o, e);
}